

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStruct
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *__rhs;
  EnumDef *pEVar1;
  pointer ppFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_90);
  std::operator+(&local_b0,"type ",&local_90);
  std::operator+(&local_d0,&local_b0," struct {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  for (ppFVar2 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    __rhs = *ppFVar2;
    if ((__rhs->deprecated == false) &&
       (((0xb < (__rhs->value).type.base_type - BASE_TYPE_UTYPE ||
         (pEVar1 = (__rhs->value).type.enum_def, pEVar1 == (EnumDef *)0x0)) ||
        (pEVar1->is_union == false)))) {
      (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_90,&this->namer_,__rhs);
      std::operator+(&local_b0,"\t",&local_90);
      std::operator+(&local_d0,&local_b0," ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      if (((__rhs->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (__rhs->presence == kOptional))
      {
        std::__cxx11::string::append((char *)code_ptr);
      }
      NativeType_abi_cxx11_(&local_70,this,&(__rhs->value).type);
      std::operator+(&local_50,&local_70," `json:\"");
      std::operator+(&local_90,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&local_b0,&local_90,"\"`");
      std::operator+(&local_d0,&local_b0,"\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::__cxx11::string::append((char *)code_ptr);
  if (struct_def->fixed == false) {
    GenNativeTablePack(this,struct_def,code_ptr);
    GenNativeTableUnPack(this,struct_def,code_ptr);
  }
  else {
    GenNativeStructPack(this,struct_def,code_ptr);
    GenNativeStructUnPack(this,struct_def,code_ptr);
  }
  return;
}

Assistant:

void GenNativeStruct(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "type " + NativeName(struct_def) + " struct {\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.deprecated) continue;
      if (IsScalar(field.value.type.base_type) &&
          field.value.type.enum_def != nullptr &&
          field.value.type.enum_def->is_union)
        continue;
      code += "\t" + namer_.Field(field) + " ";
      if (field.IsScalarOptional()) { code += "*"; }
      code += NativeType(field.value.type) + " `json:\"" + field.name + "\"`" +
              "\n";
    }
    code += "}\n\n";

    if (!struct_def.fixed) {
      GenNativeTablePack(struct_def, code_ptr);
      GenNativeTableUnPack(struct_def, code_ptr);
    } else {
      GenNativeStructPack(struct_def, code_ptr);
      GenNativeStructUnPack(struct_def, code_ptr);
    }
  }